

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O3

QString * QCoreApplication::applicationVersion(void)

{
  Data *pDVar1;
  Type *pTVar2;
  QString *in_RDI;
  
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char16_t *)0x0;
    (in_RDI->d).size = 0;
  }
  else {
    QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::instance();
    pTVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_coreappdata>_>::
             instance();
    pDVar1 = (pTVar2->applicationVersion).d.d;
    (in_RDI->d).d = pDVar1;
    (in_RDI->d).ptr = (pTVar2->applicationVersion).d.ptr;
    (in_RDI->d).size = (pTVar2->applicationVersion).d.size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  return in_RDI;
}

Assistant:

QString QCoreApplication::applicationVersion()
{
    return coreappdata() ? coreappdata()->applicationVersion : QString();
}